

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,UnaryOperator *o)

{
  pool_ref<soul::AST::Expression> *e;
  size_t *psVar1;
  Expression *pEVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  Value result;
  pool_ptr<soul::AST::Constant> constant;
  Value local_a8;
  Value local_68;
  long local_28;
  
  e = &o->source;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  iVar4 = (*(o->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(o);
  if ((char)iVar4 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_28);
    if (local_28 != 0) {
      soul::Value::Value(&local_68,(Value *)(local_28 + 0x30));
      bVar3 = UnaryOp::apply(&local_68,o->operation);
      if (bVar3) {
        pEVar2 = e->object;
        local_a8.type.category = local_68.type.category;
        local_a8.type.arrayElementCategory = local_68.type.arrayElementCategory;
        local_a8.type.isRef = local_68.type.isRef;
        local_a8.type.isConstant = local_68.type.isConstant;
        local_a8.type.primitiveType.type = local_68.type.primitiveType.type;
        local_a8.type.boundingSize = local_68.type.boundingSize;
        local_a8.type.arrayElementBoundingSize = local_68.type.arrayElementBoundingSize;
        local_a8.type.structure.object = local_68.type.structure.object;
        local_a8.allocatedData.allocatedSize = local_68.allocatedData.allocatedSize;
        local_68.type.structure.object = (Structure *)0x0;
        local_a8.allocatedData.allocatedData.numAllocated = 8;
        if (local_68.allocatedData.allocatedData.numAllocated < 9) {
          local_a8.allocatedData.allocatedData.items =
               (uchar *)local_a8.allocatedData.allocatedData.space;
          if (local_68.allocatedData.allocatedData.numActive != 0) {
            uVar5 = 0;
            do {
              *(undefined1 *)((long)local_a8.allocatedData.allocatedData.items + uVar5) =
                   *(undefined1 *)((long)local_68.allocatedData.allocatedData.items + uVar5);
              uVar5 = uVar5 + 1;
            } while (uVar5 < local_68.allocatedData.allocatedData.numActive);
          }
        }
        else {
          local_a8.allocatedData.allocatedData.items = local_68.allocatedData.allocatedData.items;
          local_a8.allocatedData.allocatedData.numAllocated =
               local_68.allocatedData.allocatedData.numAllocated;
          local_68.allocatedData.allocatedData.numAllocated = 8;
          local_68.allocatedData.allocatedData.numActive = 0;
          local_68.allocatedData.allocatedData.items =
               (uchar *)local_68.allocatedData.allocatedData.space;
        }
        o = (UnaryOperator *)
            PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context_const&,soul::Value>
                      (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                       &(pEVar2->super_Statement).super_ASTObject.context,&local_a8);
        soul::Value::~Value(&local_a8);
      }
      soul::Value::~Value(&local_68);
    }
  }
  return &((Constant *)o)->super_Expression;
}

Assistant:

AST::Expression& visit (AST::UnaryOperator& o) override
        {
            super::visit (o);

            if (failIfNotResolved (o))
                return o;

            if (auto constant = o.source->getAsConstant())
            {
                auto result = constant->value;

                if (UnaryOp::apply (result, o.operation))
                    return createConstant (o.source->context, std::move (result));
            }

            return o;
        }